

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateGetShapeLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  Result *pRVar2;
  undefined1 auStack_68 [40];
  Result r;
  
  Result::Result(&r);
  validateInputCount((Result *)auStack_68,layer,1,1);
  pRVar2 = Result::operator=(&r,(Result *)auStack_68);
  bVar1 = Result::good(pRVar2);
  std::__cxx11::string::~string((string *)(auStack_68 + 8));
  if (bVar1) {
    validateOutputCount((Result *)auStack_68,layer,1,1);
    pRVar2 = Result::operator=(&r,(Result *)auStack_68);
    bVar1 = Result::good(pRVar2);
    std::__cxx11::string::~string((string *)(auStack_68 + 8));
    if (bVar1) {
      Result::Result(__return_storage_ptr__);
      goto LAB_0059f5bb;
    }
  }
  Result::Result(__return_storage_ptr__,&r);
LAB_0059f5bb:
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateGetShapeLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    if (!(r = validateInputCount(layer, 1, 1)).good()) return r;
    if (!(r = validateOutputCount(layer, 1, 1)).good()) return r;
    return Result();
}